

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

uint64_t roaring64_bitmap_range_closed_cardinality(roaring64_bitmap_t *r,uint64_t min,uint64_t max)

{
  container_t *c;
  art_val_t *paVar1;
  int iVar2;
  uint8_t type;
  uint64_t uVar3;
  uint8_t max_high48 [6];
  uint8_t min_high48 [6];
  art_iterator_t it;
  uint local_d0;
  ushort local_cc;
  uint local_c8;
  ushort local_c4;
  art_iterator_t local_c0;
  
  if (max < min) {
    uVar3 = 0;
  }
  else {
    local_c8 = (uint)(byte)(min >> 0x38) | ((uint)(min >> 0x20) & 0xff0000) >> 8 |
               (uint)(min >> 0x18) & 0xff0000 | (uint)(min >> 8) & 0xff000000;
    local_c4 = (ushort)(min >> 0x18) & 0xff | (ushort)(min >> 8) & 0xff00;
    local_d0 = (uint)(byte)(max >> 0x38) | (uint)((max & 0xff00000000ffff) >> 0x28) |
               (uint)(max >> 0x18) & 0xff0000 | (uint)(max >> 8) & 0xff000000;
    local_cc = (ushort)(max >> 0x18) & 0xff | (ushort)(max >> 8) & 0xff00;
    art_lower_bound(&local_c0,&r->art,(art_key_chunk_t *)&local_c8);
    uVar3 = 0;
    while (paVar1 = local_c0.value, local_c0.value != (ulong *)0x0) {
      iVar2 = art_compare_keys(local_c0.key,(art_key_chunk_t *)&local_d0);
      if (0 < iVar2) {
        return uVar3;
      }
      type = (uint8_t)*paVar1;
      c = r->containers[*paVar1 >> 8];
      if (iVar2 == 0) {
        iVar2 = container_rank(c,type,(uint16_t)(max & 0xff00000000ffff));
      }
      else {
        iVar2 = container_get_cardinality(c,type);
      }
      uVar3 = uVar3 + (long)iVar2;
      iVar2 = art_compare_keys(local_c0.key,(art_key_chunk_t *)&local_c8);
      if (((short)min != 0) && (iVar2 == 0)) {
        iVar2 = container_rank(c,type,(short)min - 1);
        uVar3 = uVar3 - (long)iVar2;
      }
      art_iterator_next(&local_c0);
    }
  }
  return uVar3;
}

Assistant:

uint64_t roaring64_bitmap_range_closed_cardinality(const roaring64_bitmap_t *r,
                                                   uint64_t min, uint64_t max) {
    if (min > max) {
        return 0;
    }

    uint64_t cardinality = 0;
    uint8_t min_high48[ART_KEY_BYTES];
    uint16_t min_low16 = split_key(min, min_high48);
    uint8_t max_high48[ART_KEY_BYTES];
    uint16_t max_low16 = split_key(max, max_high48);

    art_iterator_t it = art_lower_bound((art_t *)&r->art, min_high48);
    while (it.value != NULL) {
        int max_compare_result = compare_high48(it.key, max_high48);
        if (max_compare_result > 0) {
            // We're outside the range.
            break;
        }

        leaf_t leaf = (leaf_t)*it.value;
        uint8_t typecode = get_typecode(leaf);
        container_t *container = get_container(r, leaf);
        if (max_compare_result == 0) {
            // We're at the max high key, add only the range up to the low
            // 16 bits of max.
            cardinality += container_rank(container, typecode, max_low16);
        } else {
            // We're not yet at the max high key, add the full container
            // range.
            cardinality += container_get_cardinality(container, typecode);
        }
        if (compare_high48(it.key, min_high48) == 0 && min_low16 > 0) {
            // We're at the min high key, remove the range up to the low 16
            // bits of min.
            cardinality -= container_rank(container, typecode, min_low16 - 1);
        }
        art_iterator_next(&it);
    }
    return cardinality;
}